

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O2

void __thiscall
mp::InvalidOptionValue::InvalidOptionValue<int>
          (InvalidOptionValue *this,SolverOption *opt,int value,StringRef msg)

{
  StringRef name;
  int in_stack_ffffffffffffffac;
  CStringRef in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  StringRef in_stack_ffffffffffffffc0;
  
  strlen((opt->name_)._M_dataplus._M_p);
  name.size_ = in_stack_ffffffffffffffb8;
  name.data_ = in_stack_ffffffffffffffb0.data_;
  Format<int>(name,in_stack_ffffffffffffffac,in_stack_ffffffffffffffc0);
  OptionError::OptionError(&this->super_OptionError,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  *(undefined ***)&(this->super_OptionError).super_Error.super_RuntimeError =
       &PTR__SystemError_003a2000;
  return;
}

Assistant:

InvalidOptionValue(const SolverOption &opt, T value, fmt::StringRef msg="")
    : OptionError(Format(opt.name(), value, msg)) {}